

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O3

void __thiscall
tchecker::ite_expression_t::ite_expression_t
          (ite_expression_t *this,void **vtt,shared_ptr<const_tchecker::expression_t> *condition,
          shared_ptr<const_tchecker::expression_t> *then_value,
          shared_ptr<const_tchecker::expression_t> *else_value)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  invalid_argument *this_00;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x38)) = vtt[1];
  (this->_condition).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (condition->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  p_Var2 = (condition->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (this->_condition).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_then_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (then_value->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (then_value->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_then_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_else_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (else_value->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (else_value->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_else_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if ((this->_condition).
      super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr ite_condition expression");
  }
  else if ((this->_then_value).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr then_value expression");
  }
  else {
    if ((this->_else_value).
        super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr else_value expression");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ite_expression_t::ite_expression_t(std::shared_ptr<tchecker::expression_t const> const & condition,
                                   std::shared_ptr<tchecker::expression_t const> const & then_value,
                                   std::shared_ptr<tchecker::expression_t const> const & else_value)
    : _condition(condition), _then_value(then_value), _else_value(else_value)
{
  if (_condition.get() == nullptr)
    throw std::invalid_argument("nullptr ite_condition expression");
  if (_then_value.get() == nullptr)
    throw std::invalid_argument("nullptr then_value expression");
  if (_else_value.get() == nullptr)
    throw std::invalid_argument("nullptr else_value expression");
}